

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdShrink_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit,int *pPrios)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Kit_DsdObj_t *pObj_00;
  Kit_DsdObj_t *pObj_01;
  uint *pIn;
  uint *pOut;
  int local_e0;
  int iLitNew;
  int iLitFanin;
  uint uSupps [16];
  uint piLitsNew [16];
  uint i;
  uint *pTruthNew;
  uint *pTruth;
  Kit_DsdObj_t *pObjNew;
  Kit_DsdObj_t *pObj;
  int *pPrios_local;
  int iLit_local;
  Kit_DsdNtk_t *p_local;
  Kit_DsdNtk_t *pNew_local;
  
  pTruth = (uint *)0x0;
  iVar2 = Abc_Lit2Var(iLit);
  pObj_00 = Kit_DsdNtkObj(p,iVar2);
  pNew_local._4_4_ = iLit;
  if (pObj_00 != (Kit_DsdObj_t *)0x0) {
    if (((uint)*pObj_00 >> 6 & 7) == 3) {
      for (piLitsNew[0xf] = 0; piLitsNew[0xf] < (uint)*pObj_00 >> 0x1a;
          piLitsNew[0xf] = piLitsNew[0xf] + 1) {
        uVar3 = Kit_DsdLitSupport(p,(uint)*(ushort *)
                                           (&pObj_00[1].field_0x0 + (ulong)piLitsNew[0xf] * 2));
        (&iLitNew)[piLitsNew[0xf]] = uVar3;
      }
      Kit_DsdCompSort(pPrios,(uint *)&iLitNew,(unsigned_short *)(pObj_00 + 1),(uint)*pObj_00 >> 0x1a
                      ,uSupps + 0xe);
      local_e0 = Kit_DsdShrink_rec(pNew,p,uSupps[0xe],pPrios);
      for (piLitsNew[0xf] = 1; piLitsNew[0xf] < (uint)*pObj_00 >> 0x1a;
          piLitsNew[0xf] = piLitsNew[0xf] + 1) {
        pTruth = (uint *)Kit_DsdObjAlloc(pNew,KIT_DSD_AND,2);
        iVar2 = Kit_DsdShrink_rec(pNew,p,uSupps[(ulong)piLitsNew[0xf] + 0xe],pPrios);
        *(short *)((Kit_DsdObj_t *)pTruth + 1) = (short)iVar2;
        *(short *)&((Kit_DsdObj_t *)pTruth)[1].field_0x2 = (short)local_e0;
        local_e0 = Abc_Var2Lit(*pTruth & 0x3f,0);
      }
      uVar3 = *pTruth;
      iVar2 = Abc_LitIsCompl(iLit);
      pNew_local._4_4_ = Abc_Var2Lit(uVar3 & 0x3f,iVar2);
    }
    else if (((uint)*pObj_00 >> 6 & 7) == 4) {
      for (piLitsNew[0xf] = 0; piLitsNew[0xf] < (uint)*pObj_00 >> 0x1a;
          piLitsNew[0xf] = piLitsNew[0xf] + 1) {
        uVar1 = *(ushort *)(&pObj_00[1].field_0x0 + (ulong)piLitsNew[0xf] * 2);
        iVar2 = Abc_LitIsCompl((uint)uVar1);
        if (iVar2 != 0) {
          __assert_fail("!Abc_LitIsCompl(iLitFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                        ,0x62c,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
        }
        uVar3 = Kit_DsdLitSupport(p,(uint)uVar1);
        (&iLitNew)[piLitsNew[0xf]] = uVar3;
      }
      Kit_DsdCompSort(pPrios,(uint *)&iLitNew,(unsigned_short *)(pObj_00 + 1),(uint)*pObj_00 >> 0x1a
                      ,uSupps + 0xe);
      local_e0 = Kit_DsdShrink_rec(pNew,p,uSupps[0xe],pPrios);
      for (piLitsNew[0xf] = 1; piLitsNew[0xf] < (uint)*pObj_00 >> 0x1a;
          piLitsNew[0xf] = piLitsNew[0xf] + 1) {
        pTruth = (uint *)Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,2);
        iVar2 = Kit_DsdShrink_rec(pNew,p,uSupps[(ulong)piLitsNew[0xf] + 0xe],pPrios);
        *(short *)((Kit_DsdObj_t *)pTruth + 1) = (short)iVar2;
        *(short *)&((Kit_DsdObj_t *)pTruth)[1].field_0x2 = (short)local_e0;
        local_e0 = Abc_Var2Lit(*pTruth & 0x3f,0);
      }
      uVar3 = *pTruth;
      iVar2 = Abc_LitIsCompl(iLit);
      pNew_local._4_4_ = Abc_Var2Lit(uVar3 & 0x3f,iVar2);
    }
    else {
      if (((uint)*pObj_00 >> 6 & 7) != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x63d,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
      }
      pObj_01 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)*pObj_00 >> 0x1a);
      pIn = Kit_DsdObjTruth(pObj_00);
      pOut = Kit_DsdObjTruth(pObj_01);
      Kit_TruthCopy(pOut,pIn,(uint)*pObj_00 >> 0x1a);
      for (piLitsNew[0xf] = 0; piLitsNew[0xf] < (uint)*pObj_00 >> 0x1a;
          piLitsNew[0xf] = piLitsNew[0xf] + 1) {
        iVar2 = Kit_DsdShrink_rec(pNew,p,(uint)*(ushort *)
                                                (&pObj_00[1].field_0x0 + (ulong)piLitsNew[0xf] * 2),
                                  pPrios);
        *(short *)(&pObj_01[1].field_0x0 + (ulong)piLitsNew[0xf] * 2) = (short)iVar2;
        iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_01[1].field_0x0 + (ulong)piLitsNew[0xf] * 2))
        ;
        if (iVar2 != 0) {
          iVar2 = Abc_LitRegular((uint)*(ushort *)
                                        (&pObj_01[1].field_0x0 + (ulong)piLitsNew[0xf] * 2));
          *(short *)(&pObj_01[1].field_0x0 + (ulong)piLitsNew[0xf] * 2) = (short)iVar2;
          Kit_TruthChangePhase(pOut,(uint)*pObj_01 >> 0x1a,piLitsNew[0xf]);
        }
      }
      iVar2 = Abc_LitIsCompl(iLit);
      if (iVar2 != 0) {
        Kit_TruthNot(pOut,pOut,(uint)*pObj_00 >> 0x1a);
      }
      pNew_local._4_4_ = Abc_Var2Lit((uint)*pObj_01 & 0x3f,0);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Kit_DsdShrink_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit, int pPrios[] )
{
    Kit_DsdObj_t * pObj;
    Kit_DsdObj_t * pObjNew = NULL; // Suppress "might be used uninitialized"
    unsigned * pTruth, * pTruthNew;
    unsigned i, piLitsNew[16], uSupps[16];
    int iLitFanin, iLitNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            assert( !Abc_LitIsCompl(iLitFanin) );
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        }
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdShrink_rec( pNew, p, iLitFanin, pPrios );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }
    // if the incoming phase is complemented, absorb it into the prime node
    if ( Abc_LitIsCompl(iLit) )
        Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
    return Abc_Var2Lit( pObjNew->Id, 0 );
}